

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int nni_file_type(char *name,int *ftype)

{
  int local_28 [2];
  int t;
  int rv;
  int *ftype_local;
  char *name_local;
  
  _t = ftype;
  ftype_local = (int *)name;
  name_local._4_4_ = nni_plat_file_type(name,local_28);
  if (name_local._4_4_ == 0) {
    if (local_28[0] == 0) {
      *_t = 0;
    }
    else if (local_28[0] == 1) {
      *_t = 1;
    }
    else {
      *_t = 2;
    }
    name_local._4_4_ = 0;
  }
  return name_local._4_4_;
}

Assistant:

int
nni_file_type(const char *name, int *ftype)
{
	int rv;
	int t;

	if ((rv = nni_plat_file_type(name, &t)) != 0) {
		return (rv);
	}

	switch (t) {
	case NNI_PLAT_FILE_TYPE_FILE:
		*ftype = NNI_FILE_TYPE_FILE;
		break;
	case NNI_PLAT_FILE_TYPE_DIR:
		*ftype = NNI_FILE_TYPE_DIR;
		break;
	default:
		*ftype = NNI_FILE_TYPE_OTHER;
		break;
	}
	return (0);
}